

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::FindLowestCeilingPoint(sector_t *this,vertex_t **v)

{
  line_t *plVar1;
  vertex_t **ppvVar2;
  long lVar3;
  vertex_t *pvVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = (this->ceilingplane).normal.X;
  if ((((dVar6 != 0.0) || (NAN(dVar6))) || (dVar6 = (this->ceilingplane).normal.Y, dVar6 != 0.0)) ||
     (NAN(dVar6))) {
    dVar6 = 3.4028234663852886e+38;
    pvVar4 = (vertex_t *)0x0;
    for (lVar3 = 0; lVar3 < this->linecount; lVar3 = lVar3 + 1) {
      plVar1 = this->lines[lVar3];
      dVar5 = secplane_t::ZatPoint(&this->ceilingplane,plVar1->v1);
      if (dVar5 < dVar6) {
        pvVar4 = plVar1->v1;
        dVar6 = dVar5;
      }
      dVar5 = secplane_t::ZatPoint(&this->ceilingplane,plVar1->v2);
      if (dVar5 < dVar6) {
        pvVar4 = plVar1->v2;
        dVar6 = dVar5;
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar4;
    }
  }
  else {
    if (v != (vertex_t **)0x0) {
      if (this->linecount == 0) {
        ppvVar2 = &vertexes;
      }
      else {
        ppvVar2 = &(*this->lines)->v1;
      }
      *v = ((line_t *)ppvVar2)->v1;
    }
    dVar6 = (this->ceilingplane).D;
  }
  return dVar6;
}

Assistant:

double sector_t::FindLowestCeilingPoint (vertex_t **v) const
{
	int i;
	line_t *line;
	double height = FLT_MAX;
	double probeheight;
	vertex_t *spot = NULL;

	if (!ceilingplane.isSlope())
	{
		if (v != NULL)
		{
			if (linecount == 0) *v = &vertexes[0];
			else *v = lines[0]->v1;
		}
		return ceilingplane.fD();
	}

	for (i = 0; i < linecount; i++)
	{
		line = lines[i];
		probeheight = ceilingplane.ZatPoint(line->v1);
		if (probeheight < height)
		{
			height = probeheight;
			spot = line->v1;
		}
		probeheight = ceilingplane.ZatPoint(line->v2);
		if (probeheight < height)
		{
			height = probeheight;
			spot = line->v2;
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}